

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
::rebalance_or_split
          (btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
           *this,iterator *iter)

{
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
  *pbVar1;
  undefined8 uVar2;
  long lVar3;
  byte bVar4;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
  bVar5;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
  *pbVar6;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
  *pbVar7;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
  *pbVar8;
  uint uVar9;
  int iVar10;
  allocator_type *paVar11;
  MovableOnlyInstance **args;
  long lVar12;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
  *pbVar13;
  char *__function;
  allocator_type *extraout_RDX;
  long lVar14;
  allocator_type *extraout_RDX_00;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
  bVar15;
  uint uVar16;
  int i;
  size_type sVar17;
  size_type sVar18;
  long lVar19;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
  bVar20;
  size_type sVar21;
  undefined1 in_R9B;
  undefined7 in_register_00000089;
  ulong uVar22;
  bool bVar23;
  iterator parent_iter;
  iterator local_40;
  
  pbVar8 = iter->node;
  if (((ulong)pbVar8 & 7) != 0) goto LAB_001b3f22;
  bVar5 = pbVar8[0xb];
  paVar11 = (allocator_type *)(ulong)(byte)bVar5;
  bVar20 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
            )0x64;
  if (bVar5 != (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                )0x0) {
    bVar20 = bVar5;
  }
  if (pbVar8[10] != bVar20) {
    __assert_fail("node->count() == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb53,
                  "void phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                 );
  }
  if (pbVar8[10] !=
      (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
       )0x64) {
    __assert_fail("kNodeValues == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb54,
                  "void phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                 );
  }
  pbVar13 = *(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
              **)pbVar8;
  if (pbVar8 == (this->root_).
                super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
                .
                super__Tuple_impl<1UL,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
                .
                super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
                .
                super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*,_false>
                ._M_head_impl) {
    pbVar13 = new_internal_node(this,pbVar13);
    btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
    ::init_child(pbVar13,0,
                 (this->root_).
                 super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
                 .
                 super__Tuple_impl<1UL,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
                 .
                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
                 .
                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*,_false>
                 ._M_head_impl);
    (this->root_).
    super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*,_false>
    ._M_head_impl = pbVar13;
    pbVar8 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
             ::child(pbVar13,0);
    if (((ulong)pbVar8 & 7) != 0) goto LAB_001b3f22;
    if ((pbVar8[0xb] !=
         (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
          )0x0) &&
       (pbVar8 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                 ::child(pbVar13,0), pbVar8 != this->rightmost_)) {
      __assert_fail("!parent->child(0)->leaf() || parent->child(0) == rightmost_",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xba0,
                    "void phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                   );
    }
    goto LAB_001b3ac7;
  }
  if ((ulong)(byte)pbVar8[8] == 0) goto LAB_001b39e4;
  pbVar6 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
           ::child(pbVar13,(ulong)(byte)pbVar8[8] - 1);
  if (((ulong)pbVar6 & 7) != 0) goto LAB_001b3f22;
  if ((pbVar6[0xb] !=
       (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
        )0x0) &&
     (pbVar6[0xb] !=
      (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
       )0x64)) {
    __assert_fail("left->max_count() == kNodeValues",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb5c,
                  "void phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                 );
  }
  bVar5 = pbVar6[10];
  if ((ulong)(byte)bVar5 < 100) {
    iVar10 = iter->position;
    paVar11 = (allocator_type *)CONCAT71((int7)((ulong)paVar11 >> 8),iVar10 < 100);
    bVar4 = (byte)(100U - (char)bVar5) >> (iVar10 < 100);
    sVar21 = 1;
    if (1 < bVar4) {
      sVar21 = (size_type)bVar4;
    }
    bVar20 = SUB81(sVar21,0);
    pbVar8 = iter->node;
    uVar16 = (uint)sVar21;
    if ((iVar10 < (int)uVar16) && (99 < (byte)((char)bVar20 + (char)bVar5))) goto LAB_001b39e4;
    if (((ulong)pbVar8 & 7) == 0) {
      uVar22 = *(ulong *)pbVar6;
      if (uVar22 != *(ulong *)pbVar8) {
        __assert_fail("parent() == right->parent()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x87f,
                      "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                     );
      }
      if ((byte)pbVar6[8] + 1 != (uint)(byte)pbVar8[8]) {
        __assert_fail("position() + 1 == right->position()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x880,
                      "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                     );
      }
      if ((byte)pbVar8[10] < (byte)bVar5) {
        __assert_fail("right->count() >= count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x881,
                      "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                     );
      }
      if ((byte)pbVar8[10] < (byte)bVar20) {
        __assert_fail("to_move <= right->count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x883,
                      "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                     );
      }
      if ((uVar22 & 7) == 0) {
        args = (MovableOnlyInstance **)((ulong)(byte)pbVar6[8] * 0x10);
        btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,1616,false>>
        ::value_init<phmap::test_internal::MovableOnlyInstance*>
                  ((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,1616,false>>
                    *)pbVar6,(ulong)(byte)bVar5,(allocator_type *)((long)args + uVar22 + 0x10),args)
        ;
        uVar22 = (ulong)(uVar16 - 1);
        btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
        ::uninitialized_move_n
                  (pbVar8,uVar22,0,(ulong)(byte)pbVar6[10] + 1,pbVar6,
                   (allocator_type *)CONCAT71(in_register_00000089,in_R9B));
        if ((*(ulong *)pbVar6 & 7) == 0) {
          lVar12 = *(ulong *)pbVar6 + (ulong)(byte)pbVar6[8] * 0x10;
          uVar2 = *(undefined8 *)(pbVar8 + uVar22 * 0x10 + 0x10);
          *(undefined8 *)(lVar12 + 0x10) = uVar2;
          if (*(char *)(lVar12 + 0x18) == '\x01') {
            test_internal::BaseCountedInstance::num_live_instances_ =
                 test_internal::BaseCountedInstance::num_live_instances_ + -1;
          }
          paVar11 = (allocator_type *)
                    CONCAT71((int7)((ulong)uVar2 >> 8),pbVar8[uVar22 * 0x10 + 0x18]);
          *(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
            *)(lVar12 + 0x18) = pbVar8[uVar22 * 0x10 + 0x18];
          pbVar8[uVar22 * 0x10 + 0x18] =
               (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                )0x0;
          test_internal::BaseCountedInstance::num_moves_ =
               test_internal::BaseCountedInstance::num_moves_ + 1;
          uVar9 = uVar16;
          if (bVar20 != pbVar8[10]) {
            pbVar13 = pbVar8 + 0x10;
            pbVar7 = pbVar13 + (ulong)(byte)pbVar8[10] * 0x10;
            paVar11 = (allocator_type *)(ulong)(uVar16 << 4);
            do {
              *(undefined8 *)pbVar13 = *(undefined8 *)(pbVar13 + (long)paVar11);
              if (pbVar13[8] ==
                  (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                   )0x1) {
                test_internal::BaseCountedInstance::num_live_instances_ =
                     test_internal::BaseCountedInstance::num_live_instances_ + -1;
              }
              pbVar1 = pbVar13 + (long)paVar11;
              pbVar13[8] = pbVar1[8];
              pbVar1[8] = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                           )0x0;
              test_internal::BaseCountedInstance::num_moves_ =
                   test_internal::BaseCountedInstance::num_moves_ + 1;
              pbVar13 = pbVar13 + 0x10;
            } while (pbVar1 + 0x10 != pbVar7);
            uVar9 = (uint)(byte)pbVar8[10];
          }
          lVar12 = -sVar21;
          do {
            btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
            ::value_destroy(pbVar8,lVar12 + (ulong)uVar9,paVar11);
            lVar12 = lVar12 + 1;
            paVar11 = extraout_RDX;
          } while (lVar12 != 0);
          if (pbVar6[0xb] ==
              (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
               )0x0) {
            sVar18 = 0;
            do {
              bVar5 = pbVar6[10];
              sVar17 = sVar18 + 1;
              pbVar13 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                        ::child(pbVar8,sVar18);
              btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
              ::init_child(pbVar6,(int)sVar18 + (uint)(byte)bVar5 + 1,pbVar13);
              sVar18 = sVar17;
            } while (sVar21 != sVar17);
            if ((byte)bVar20 <= (byte)pbVar8[10]) {
              lVar12 = 0;
              do {
                sVar18 = sVar21 + lVar12;
                bVar5 = pbVar8[0xb];
                if (pbVar8[0xb] ==
                    (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                     )0x0) {
                  bVar5 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                           )0x64;
                }
                if ((int)(uint)(byte)bVar5 < (int)sVar18) {
                  __assert_fail("i + to_move <= right->max_count()",
                                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                                ,0x89c,
                                "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                               );
                }
                pbVar13 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                          ::child(pbVar8,sVar18);
                btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                ::init_child(pbVar8,(int)lVar12,pbVar13);
                btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                ::mutable_child(pbVar8,sVar18);
                bVar23 = lVar12 < (long)((byte)pbVar8[10] - sVar21);
                lVar12 = lVar12 + 1;
              } while (bVar23);
            }
          }
          pbVar6[10] = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                        )((char)pbVar6[10] + (char)bVar20);
          pbVar8[10] = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                        )((char)pbVar8[10] - (char)bVar20);
          pbVar8 = iter->node;
          if (((ulong)pbVar8 & 7) == 0) {
            bVar5 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                     )0x64;
            if (pbVar8[0xb] !=
                (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                 )0x0) {
              bVar5 = pbVar8[0xb];
            }
            if ((uint)(byte)bVar5 - (uint)(byte)pbVar8[10] != uVar16) {
              __assert_fail("node->max_count() - node->count() == to_move",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0xb69,
                            "void phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                           );
            }
            iVar10 = iter->position - uVar16;
            iter->position = iVar10;
            if (iVar10 < 0) {
              iter->position = (uint)(byte)pbVar6[10] + iVar10 + 1;
              iter->node = pbVar6;
              pbVar8 = pbVar6;
            }
            bVar5 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                     )0x64;
            if (pbVar8[0xb] !=
                (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                 )0x0) {
              bVar5 = pbVar8[0xb];
            }
            if ((byte)pbVar8[10] < (byte)bVar5) {
              return;
            }
            __assert_fail("node->count() < node->max_count()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xb70,
                          "void phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                         );
          }
          goto LAB_001b3f22;
        }
      }
      goto LAB_001b3fcf;
    }
LAB_001b3fb5:
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
  }
  else {
    pbVar8 = iter->node;
LAB_001b39e4:
    if ((((ulong)pbVar8 & 7) == 0) && (((ulong)pbVar13 & 7) == 0)) {
      if ((byte)pbVar8[8] < (byte)pbVar13[10]) {
        pbVar8 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                 ::child(pbVar13,(ulong)(byte)pbVar8[8] + 1);
        if (((ulong)pbVar8 & 7) != 0) goto LAB_001b3f22;
        if ((pbVar8[0xb] !=
             (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
              )0x0) &&
           (pbVar8[0xb] !=
            (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
             )0x64)) {
          __assert_fail("right->max_count() == kNodeValues",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xb79,
                        "void phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                       );
        }
        bVar5 = pbVar8[10];
        if ((byte)bVar5 < 100) {
          bVar4 = (byte)(100U - (char)bVar5) >> (0 < iter->position);
          sVar21 = 1;
          if (1 < bVar4) {
            sVar21 = (size_type)bVar4;
          }
          pbVar6 = iter->node;
          if (((ulong)pbVar6 & 7) != 0) goto LAB_001b3f22;
          bVar15 = SUB81(sVar21,0);
          bVar20 = pbVar6[10];
          paVar11 = (allocator_type *)(ulong)(byte)bVar20;
          uVar16 = (uint)sVar21;
          if ((iter->position <= (int)((byte)bVar20 - uVar16)) || (uVar16 + (byte)bVar5 < 100)) {
            if (*(long *)pbVar6 != *(long *)pbVar8) {
              __assert_fail("parent() == right->parent()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8ab,
                            "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                           );
            }
            if ((byte)pbVar6[8] + 1 != (uint)(byte)pbVar8[8]) {
              __assert_fail("position() + 1 == right->position()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8ac,
                            "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                           );
            }
            if ((byte)bVar20 < (byte)bVar5) {
              __assert_fail("count() >= right->count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8ad,
                            "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                           );
            }
            if ((byte)bVar20 < (byte)bVar15) {
              __assert_fail("to_move <= count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8af,
                            "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                           );
            }
            if ((byte)bVar5 < (byte)bVar15) {
              btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
              ::uninitialized_move_n
                        (pbVar8,(ulong)(byte)bVar5,0,sVar21,pbVar8,
                         (allocator_type *)CONCAT71(in_register_00000089,in_R9B));
              if ((*(ulong *)pbVar6 & 7) == 0) {
                sVar18 = sVar21 - 1;
                btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,1616,false>>
                ::value_init<phmap::test_internal::MovableOnlyInstance*>
                          ((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,1616,false>>
                            *)pbVar8,sVar18,
                           (allocator_type *)
                           ((long)((ulong)(byte)pbVar6[8] * 0x10) + *(ulong *)pbVar6 + 0x10),
                           (MovableOnlyInstance **)((ulong)(byte)pbVar6[8] * 0x10));
                sVar17 = (size_type)(int)(~(uint)(byte)pbVar8[10] + uVar16);
                btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                ::uninitialized_move_n
                          (pbVar6,sVar17,(byte)pbVar6[10] - sVar17,(ulong)(byte)pbVar8[10],pbVar8,
                           (allocator_type *)CONCAT71(in_register_00000089,in_R9B));
                if (sVar17 != sVar18) {
                  bVar5 = pbVar6[10];
                  lVar12 = ((byte)bVar5 - sVar18) * 0x10 + 0x10;
                  lVar19 = 0;
                  lVar14 = test_internal::BaseCountedInstance::num_live_instances_;
                  do {
                    test_internal::BaseCountedInstance::num_moves_ =
                         test_internal::BaseCountedInstance::num_moves_ + 1;
                    *(undefined8 *)(pbVar8 + lVar19 + 0x10) =
                         *(undefined8 *)(pbVar6 + lVar19 + lVar12);
                    if (pbVar8[lVar19 + 0x18] ==
                        (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                         )0x1) {
                      lVar14 = lVar14 + -1;
                      test_internal::BaseCountedInstance::num_live_instances_ = lVar14;
                    }
                    lVar3 = lVar19 + lVar12;
                    pbVar8[lVar19 + 0x18] = pbVar6[lVar3 + 8];
                    pbVar6[lVar3 + 8] =
                         (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                          )0x0;
                    lVar19 = lVar19 + 0x10;
                  } while (pbVar6 + lVar3 + 0x10 != pbVar6 + ((byte)bVar5 - sVar17) * 0x10 + 0x10);
                }
LAB_001b3dcf:
                if ((*(ulong *)pbVar6 & 7) == 0) {
                  lVar14 = (byte)pbVar6[10] - sVar21;
                  lVar12 = *(ulong *)pbVar6 + (ulong)(byte)pbVar6[8] * 0x10;
                  uVar2 = *(undefined8 *)(pbVar6 + lVar14 * 0x10 + 0x10);
                  *(undefined8 *)(lVar12 + 0x10) = uVar2;
                  if (*(char *)(lVar12 + 0x18) == '\x01') {
                    test_internal::BaseCountedInstance::num_live_instances_ =
                         test_internal::BaseCountedInstance::num_live_instances_ + -1;
                  }
                  paVar11 = (allocator_type *)
                            CONCAT71((int7)((ulong)uVar2 >> 8),pbVar6[lVar14 * 0x10 + 0x18]);
                  *(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                    *)(lVar12 + 0x18) = pbVar6[lVar14 * 0x10 + 0x18];
                  pbVar6[lVar14 * 0x10 + 0x18] =
                       (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                        )0x0;
                  test_internal::BaseCountedInstance::num_moves_ =
                       test_internal::BaseCountedInstance::num_moves_ + 1;
                  bVar5 = pbVar6[10];
                  lVar12 = -sVar21;
                  do {
                    btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                    ::value_destroy(pbVar6,(ulong)(byte)bVar5 + lVar12,paVar11);
                    lVar12 = lVar12 + 1;
                    paVar11 = extraout_RDX_00;
                  } while (lVar12 != 0);
                  if (pbVar6[0xb] ==
                      (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                       )0x0) {
                    sVar21 = (size_type)(byte)pbVar8[10];
                    do {
                      pbVar13 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                                ::child(pbVar8,sVar21);
                      btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                      ::init_child(pbVar8,uVar16 + (int)sVar21,pbVar13);
                      btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                      ::mutable_child(pbVar8,sVar21);
                      bVar23 = sVar21 != 0;
                      sVar21 = sVar21 - 1;
                    } while (bVar23);
                    iVar10 = 1 - uVar16;
                    i = 0;
                    do {
                      pbVar13 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                                ::child(pbVar6,(long)(int)((uint)(byte)pbVar6[10] + iVar10));
                      btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                      ::init_child(pbVar8,i,pbVar13);
                      btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                      ::mutable_child(pbVar6,(long)(int)((uint)(byte)pbVar6[10] + iVar10));
                      iVar10 = iVar10 + 1;
                      i = i + 1;
                    } while (iVar10 != 1);
                  }
                  pbVar6[10] = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                                )((char)pbVar6[10] - (char)bVar15);
                  pbVar8[10] = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                                )((char)pbVar8[10] + (char)bVar15);
                  pbVar13 = iter->node;
                  if (((ulong)pbVar13 & 7) == 0) {
                    if ((int)(uint)(byte)pbVar13[10] < iter->position) {
                      iter->position = iter->position + ~(uint)(byte)pbVar13[10];
                      iter->node = pbVar8;
                      pbVar13 = pbVar8;
                    }
                    bVar5 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                             )0x64;
                    if (pbVar13[0xb] !=
                        (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                         )0x0) {
                      bVar5 = pbVar13[0xb];
                    }
                    if ((byte)pbVar13[10] < (byte)bVar5) {
                      return;
                    }
                    __assert_fail("node->count() < node->max_count()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                                  ,0xb8b,
                                  "void phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                                 );
                  }
                  goto LAB_001b3f22;
                }
              }
            }
            else {
              btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
              ::uninitialized_move_n
                        (pbVar8,sVar21,(long)(int)((byte)bVar5 - uVar16),(ulong)(byte)bVar5,pbVar8,
                         (allocator_type *)CONCAT71(in_register_00000089,in_R9B));
              bVar5 = pbVar8[10];
              if (((byte)bVar15 < (byte)bVar5) && (-1 < (int)(~uVar16 + (uint)(byte)bVar5))) {
                pbVar13 = pbVar8 + (ulong)(byte)bVar5 * 0x10;
                lVar12 = (ulong)(~uVar16 + (uint)(byte)bVar5) * 0x10 + 0x20;
                do {
                  *(undefined8 *)pbVar13 = *(undefined8 *)(pbVar8 + lVar12 + -0x10);
                  if (pbVar13[8] ==
                      (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                       )0x1) {
                    test_internal::BaseCountedInstance::num_live_instances_ =
                         test_internal::BaseCountedInstance::num_live_instances_ + -1;
                  }
                  pbVar13[8] = pbVar8[lVar12 + -8];
                  pbVar8[lVar12 + -8] =
                       (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                        )0x0;
                  test_internal::BaseCountedInstance::num_moves_ =
                       test_internal::BaseCountedInstance::num_moves_ + 1;
                  pbVar13 = pbVar13 + -0x10;
                  lVar12 = lVar12 + -0x10;
                } while (0x1f < lVar12);
              }
              if ((*(ulong *)pbVar6 & 7) == 0) {
                lVar14 = *(ulong *)pbVar6 + (ulong)(byte)pbVar6[8] * 0x10;
                lVar12 = sVar21 - 1;
                lVar19 = lVar12 * 0x10;
                *(undefined8 *)(pbVar8 + lVar19 + 0x10) = *(undefined8 *)(lVar14 + 0x10);
                if (pbVar8[lVar19 + 0x18] ==
                    (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                     )0x1) {
                  test_internal::BaseCountedInstance::num_live_instances_ =
                       test_internal::BaseCountedInstance::num_live_instances_ + -1;
                }
                pbVar8[lVar19 + 0x18] =
                     *(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                       *)(lVar14 + 0x18);
                *(undefined1 *)(lVar14 + 0x18) = 0;
                test_internal::BaseCountedInstance::num_moves_ =
                     test_internal::BaseCountedInstance::num_moves_ + 1;
                if (lVar12 != 0) {
                  bVar5 = pbVar6[10];
                  lVar12 = ((ulong)(byte)bVar5 - lVar12) * 0x10 + 0x10;
                  lVar14 = 0;
                  do {
                    *(undefined8 *)(pbVar8 + lVar14 + 0x10) =
                         *(undefined8 *)(pbVar6 + lVar14 + lVar12);
                    if (pbVar8[lVar14 + 0x18] ==
                        (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                         )0x1) {
                      test_internal::BaseCountedInstance::num_live_instances_ =
                           test_internal::BaseCountedInstance::num_live_instances_ + -1;
                    }
                    lVar19 = lVar14 + lVar12;
                    pbVar8[lVar14 + 0x18] = pbVar6[lVar19 + 8];
                    pbVar6[lVar19 + 8] =
                         (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                          )0x0;
                    test_internal::BaseCountedInstance::num_moves_ =
                         test_internal::BaseCountedInstance::num_moves_ + 1;
                    lVar14 = lVar14 + 0x10;
                  } while (pbVar6 + lVar19 + 0x10 != pbVar6 + (ulong)(byte)bVar5 * 0x10 + 0x10);
                }
                goto LAB_001b3dcf;
              }
            }
LAB_001b3fcf:
            __function = 
            "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
            ;
            goto LAB_001b3f37;
          }
        }
      }
      if ((pbVar13[0xb] !=
           (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
            )0x0) &&
         (pbVar13[0xb] !=
          (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
           )0x64)) {
        __assert_fail("parent->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xb93,
                      "void phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                     );
      }
      if (pbVar13[10] ==
          (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
           )0x64) {
        pbVar8 = iter->node;
        if (((ulong)pbVar8 & 7) != 0) goto LAB_001b3fb5;
        paVar11 = *(allocator_type **)pbVar8;
        local_40.position = (int)(byte)pbVar8[8];
        local_40.node =
             (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
              *)paVar11;
        rebalance_or_split(this,&local_40);
      }
LAB_001b3ac7:
      if (((ulong)iter->node & 7) == 0) {
        if (iter->node[0xb] ==
            (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
             )0x0) {
          pbVar8 = new_internal_node(this,pbVar13);
          btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
          ::split(iter->node,iter->position,pbVar8,paVar11);
        }
        else {
          pbVar8 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                    *)Allocate<8ul,std::allocator<phmap::test_internal::MovableOnlyInstance>>
                                ((allocator<phmap::test_internal::MovableOnlyInstance> *)this,0x650)
          ;
          if (((ulong)pbVar8 & 7) != 0) {
            __function = 
            "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = char]"
            ;
            goto LAB_001b3f37;
          }
          *(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
            **)pbVar8 = pbVar13;
          *(undefined4 *)(pbVar8 + 8) = 0x64000000;
          btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
          ::split(iter->node,iter->position,pbVar8,paVar11);
          if (this->rightmost_ == iter->node) {
            this->rightmost_ = pbVar8;
          }
        }
        if (((ulong)iter->node & 7) == 0) {
          bVar5 = iter->node[10];
          if ((int)(uint)(byte)bVar5 < iter->position) {
            iter->position = iter->position + ~(uint)(byte)bVar5;
            iter->node = pbVar8;
          }
          return;
        }
      }
    }
LAB_001b3f22:
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
    ;
  }
LAB_001b3f37:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

void btree<P>::rebalance_or_split(iterator *iter) {
        node_type *&node = iter->node;
        int &insert_position = iter->position;
        assert(node->count() == node->max_count());
        assert(kNodeValues == node->max_count());

        // First try to make room on the node by rebalancing.
        node_type *parent = node->parent();
        if (node != root()) {
            if (node->position() > 0) {
                // Try rebalancing with our left sibling.
                node_type *left = parent->child(node->position() - 1);
                assert(left->max_count() == kNodeValues);
                if (left->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the end of the right node then we bias rebalancing to
                    // fill up the left node.
                    int to_move = (kNodeValues - left->count()) /
                        (1 + (insert_position < kNodeValues));
                    to_move = (std::max)(1, to_move);

                    if (((insert_position - to_move) >= 0) ||
                        ((left->count() + to_move) < kNodeValues)) {
                        left->rebalance_right_to_left(to_move, node, mutable_allocator());

                        assert(node->max_count() - node->count() == to_move);
                        insert_position = insert_position - to_move;
                        if (insert_position < 0) {
                            insert_position = insert_position + left->count() + 1;
                            node = left;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            if (node->position() < parent->count()) {
                // Try rebalancing with our right sibling.
                node_type *right = parent->child(node->position() + 1);
                assert(right->max_count() == kNodeValues);
                if (right->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the _beginning of the left node then we bias rebalancing
                    // to fill up the right node.
                    int to_move =
                        (kNodeValues - right->count()) / (1 + (insert_position > 0));
                    to_move = (std::max)(1, to_move);

                    if ((insert_position <= (node->count() - to_move)) ||
                        ((right->count() + to_move) < kNodeValues)) {
                        node->rebalance_left_to_right(to_move, right, mutable_allocator());

                        if (insert_position > node->count()) {
                            insert_position = insert_position - node->count() - 1;
                            node = right;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            // Rebalancing failed, make sure there is room on the parent node for a new
            // value.
            assert(parent->max_count() == kNodeValues);
            if (parent->count() == kNodeValues) {
                iterator parent_iter(node->parent(), node->position());
                rebalance_or_split(&parent_iter);
            }
        } else {
            // Rebalancing not possible because this is the root node.
            // Create a new root node and set the current root node as the child of the
            // new root.
            parent = new_internal_node(parent);
            parent->init_child(0, root());
            mutable_root() = parent;
            // If the former root was a leaf node, then it's now the rightmost node.
            assert(!parent->child(0)->leaf() || parent->child(0) == rightmost_);
        }

        // Split the node.
        node_type *split_node;
        if (node->leaf()) {
            split_node = new_leaf_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
            if (rightmost_ == node) rightmost_ = split_node;
        } else {
            split_node = new_internal_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
        }

        if (insert_position > node->count()) {
            insert_position = insert_position - node->count() - 1;
            node = split_node;
        }
    }